

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O1

string * __thiscall
duckdb::TypeIdToString_abi_cxx11_(string *__return_storage_ptr__,duckdb *this,PhysicalType type)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  switch((int)this) {
  case 1:
    pcVar2 = "BOOL";
    pcVar1 = "";
    break;
  case 2:
    pcVar2 = "UINT8";
    pcVar1 = "";
    break;
  case 3:
    pcVar2 = "INT8";
    pcVar1 = "";
    break;
  case 4:
    pcVar2 = "UINT16";
    pcVar1 = "";
    break;
  case 5:
    pcVar2 = "INT16";
    pcVar1 = "";
    break;
  case 6:
    pcVar2 = "UINT32";
    pcVar1 = "";
    break;
  case 7:
    pcVar2 = "INT32";
    pcVar1 = "";
    break;
  case 8:
    pcVar2 = "UINT64";
    pcVar1 = "";
    break;
  case 9:
    pcVar2 = "INT64";
    pcVar1 = "";
    break;
  case 10:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x16:
  case 0x19:
  case 0x1a:
  case 0x1b:
  case 0x1c:
switchD_01400c19_caseD_a:
    pcVar2 = "INVALID";
    pcVar1 = "";
    break;
  case 0xb:
    pcVar2 = "FLOAT";
    pcVar1 = "";
    break;
  case 0xc:
    pcVar2 = "DOUBLE";
    pcVar1 = "";
    break;
  case 0x15:
    pcVar2 = "INTERVAL";
    pcVar1 = "";
    break;
  case 0x17:
    pcVar2 = "LIST";
    pcVar1 = "";
    break;
  case 0x18:
    pcVar2 = "STRUCT";
    pcVar1 = "";
    break;
  case 0x1d:
    pcVar2 = "ARRAY";
    pcVar1 = "";
    break;
  default:
    switch((int)this) {
    case 200:
      pcVar2 = "VARCHAR";
      pcVar1 = "";
      break;
    default:
      goto switchD_01400c19_caseD_a;
    case 0xcb:
      pcVar2 = "UINT128";
      pcVar1 = "";
      break;
    case 0xcc:
      pcVar2 = "INT128";
      pcVar1 = "";
      break;
    case 0xcd:
      pcVar2 = "UNKNOWN";
      pcVar1 = "";
      break;
    case 0xce:
      pcVar2 = "BIT";
      pcVar1 = "";
    }
  }
  ::std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

string TypeIdToString(PhysicalType type) {
	switch (type) {
	case PhysicalType::BOOL:
		return "BOOL";
	case PhysicalType::INT8:
		return "INT8";
	case PhysicalType::INT16:
		return "INT16";
	case PhysicalType::INT32:
		return "INT32";
	case PhysicalType::INT64:
		return "INT64";
	case PhysicalType::UINT8:
		return "UINT8";
	case PhysicalType::UINT16:
		return "UINT16";
	case PhysicalType::UINT32:
		return "UINT32";
	case PhysicalType::UINT64:
		return "UINT64";
	case PhysicalType::INT128:
		return "INT128";
	case PhysicalType::UINT128:
		return "UINT128";
	case PhysicalType::FLOAT:
		return "FLOAT";
	case PhysicalType::DOUBLE:
		return "DOUBLE";
	case PhysicalType::VARCHAR:
		return "VARCHAR";
	case PhysicalType::INTERVAL:
		return "INTERVAL";
	case PhysicalType::STRUCT:
		return "STRUCT";
	case PhysicalType::LIST:
		return "LIST";
	case PhysicalType::ARRAY:
		return "ARRAY";
	case PhysicalType::INVALID:
		return "INVALID";
	case PhysicalType::BIT:
		return "BIT";
	case PhysicalType::UNKNOWN:
		return "UNKNOWN";
	}
	return "INVALID";
}